

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int send_new_connection_id
              (quicly_conn_t *conn,quicly_send_context_t *s,st_quicly_local_cid_t *new_cid)

{
  uint64_t *puVar1;
  byte bVar2;
  ulong uVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  ulong __n;
  uint8_t *puVar8;
  quicly_sent_t *sent;
  quicly_sent_t *local_40;
  uint8_t *local_38;
  
  uVar3 = new_cid->sequence;
  lVar7 = 4;
  if ((0x3f < uVar3) && (lVar7 = 5, 0x3fff < uVar3)) {
    lVar7 = (ulong)(0x3fffffff < uVar3) * 4 + 7;
  }
  iVar6 = allocate_ack_eliciting_frame
                    (conn,s,lVar7 + (ulong)(new_cid->cid).len + 0x10,&local_40,
                     on_ack_new_connection_id);
  if (iVar6 == 0) {
    (local_40->data).packet.packet_number = new_cid->sequence;
    puVar4 = s->dst;
    uVar3 = new_cid->sequence;
    bVar2 = (new_cid->cid).len;
    __n = (ulong)bVar2;
    *puVar4 = '\x18';
    puVar8 = puVar4 + 1;
    if (0x3f < uVar3) {
      if (uVar3 < 0x4000) {
        puVar4[1] = (byte)(uVar3 >> 8) | 0x40;
        puVar8 = puVar4 + 2;
      }
      else {
        send_new_connection_id_cold_1();
        puVar8 = local_38;
      }
    }
    *puVar8 = (uint8_t)uVar3;
    puVar8[1] = '\0';
    puVar8[2] = bVar2;
    memcpy(puVar8 + 3,&new_cid->cid,__n);
    uVar5 = *(undefined8 *)(new_cid->stateless_reset_token + 8);
    *(undefined8 *)(puVar8 + __n + 3) = *(undefined8 *)new_cid->stateless_reset_token;
    *(undefined8 *)(puVar8 + __n + 0xb) = uVar5;
    s->dst = puVar8 + __n + 0x13;
    puVar1 = &(conn->super).stats.num_frames_sent.new_connection_id;
    *puVar1 = *puVar1 + 1;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int send_new_connection_id(quicly_conn_t *conn, quicly_send_context_t *s, struct st_quicly_local_cid_t *new_cid)
{
    int ret;
    quicly_sent_t *sent;
    uint64_t retire_prior_to = 0; /* TODO */

    ret = allocate_ack_eliciting_frame(
        conn, s, quicly_new_connection_id_frame_capacity(new_cid->sequence, retire_prior_to, new_cid->cid.len), &sent,
        on_ack_new_connection_id);
    if (ret != 0)
        return ret;
    sent->data.new_connection_id.sequence = new_cid->sequence;

    s->dst = quicly_encode_new_connection_id_frame(s->dst, new_cid->sequence, retire_prior_to, new_cid->cid.cid, new_cid->cid.len,
                                                   new_cid->stateless_reset_token);

    ++conn->super.stats.num_frames_sent.new_connection_id;
    QUICLY_PROBE(NEW_CONNECTION_ID_SEND, conn, conn->stash.now, new_cid->sequence, retire_prior_to,
                 QUICLY_PROBE_HEXDUMP(new_cid->cid.cid, new_cid->cid.len),
                 QUICLY_PROBE_HEXDUMP(new_cid->stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN));

    return 0;
}